

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

bool __thiscall Clasp::Solver::simplify(Solver *this)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  long *plVar4;
  
  bVar2 = true;
  if ((this->levels_).super_type.ebo_.size != 0) {
    return true;
  }
  if ((this->conflict_).ebo_.size == 0) {
    uVar3 = *(uint *)&this->field_0x204 & 0x3fffffff;
    if (uVar3 != (this->assign_).trail.ebo_.size) {
      bVar1 = simplifySAT(this);
      if (!bVar1) goto LAB_00168cfb;
      plVar4 = (long *)((this->heuristic_).ptr_ & 0xfffffffffffffffe);
      (**(code **)(*plVar4 + 0x38))(plVar4,this,uVar3);
    }
    if ((this->field_0x207 & 0x40) != 0) {
      simplifySAT(this);
    }
  }
  else {
LAB_00168cfb:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Solver::simplify() {
	if (decisionLevel() != 0) return true;
	if (hasConflict())        return false;
	if (lastSimp_ != (uint32)assign_.trail.size()) {
		uint32 old = lastSimp_;
		if (!simplifySAT()) { return false; }
		assert(lastSimp_ == (uint32)assign_.trail.size());
		heuristic_->simplify(*this, old);
	}
	if (shufSimp_) { simplifySAT(); }
	return true;
}